

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numcontext.cpp
# Opt level: O0

void __thiscall NumContext::NumContext(NumContext *this,int num)

{
  string *this_00;
  allocator<char> local_85 [13];
  string local_78 [32];
  char local_58 [8];
  char buf [64];
  int num_local;
  NumContext *this_local;
  
  buf._60_4_ = num;
  Context::Context(&this->super_Context);
  (this->super_Context)._vptr_Context = (_func_int **)&PTR__NumContext_00106d38;
  sprintf(local_58,"%d",(ulong)(uint)buf._60_4_);
  this_00 = (string *)operator_new(0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,local_58,local_85);
  std::__cxx11::string::string(local_78,this_00);
  (*(this->super_Context)._vptr_Context[3])(this,local_78);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(local_85);
  return;
}

Assistant:

NumContext::NumContext(int num)
{
	char buf[64];
	sprintf(buf,"%d", num);

	setData(*(new string(buf)));
}